

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_encoder.h
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerTraversalValenceEncoder::Init
          (MeshEdgebreakerTraversalValenceEncoder *this,MeshEdgebreakerEncoderImplInterface *encoder
          )

{
  pointer piVar1;
  pointer pIVar2;
  pointer pIVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar6;
  ulong uVar7;
  CornerTable *pCVar5;
  
  (this->super_MeshEdgebreakerTraversalEncoder).encoder_impl_ = encoder;
  this->min_valence_ = 2;
  this->max_valence_ = 7;
  iVar4 = (*encoder->_vptr_MeshEdgebreakerEncoderImplInterface[8])(encoder);
  pCVar5 = (CornerTable *)CONCAT44(extraout_var,iVar4);
  this->corner_table_ = pCVar5;
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->vertex_valences_).vector_,
             (long)(int)((ulong)((long)(pCVar5->vertex_corners_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pCVar5->vertex_corners_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2));
  if (((long)(this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) {
    uVar7 = 0;
    do {
      iVar4 = CornerTable::Valence(this->corner_table_,(VertexIndex)(uint)uVar7);
      piVar1 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar1[uVar7] = iVar4;
      uVar7 = uVar7 + 1;
    } while (uVar7 < ((ulong)((long)(this->vertex_valences_).vector_.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar1) >> 2 &
                     0xffffffff));
  }
  std::
  vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
  ::resize(&(this->corner_to_vertex_map_).vector_,
           (long)(int)((ulong)((long)(this->corner_table_->corner_to_vertex_map_).vector_.
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->corner_table_->corner_to_vertex_map_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2));
  pIVar2 = (this->corner_table_->corner_to_vertex_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(this->corner_table_->corner_to_vertex_map_).vector_.
                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2;
  if ((uVar7 & 0x3fffffffc) != 0) {
    pIVar3 = (this->corner_to_vertex_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      pIVar3[uVar6].value_ = pIVar2[uVar6].value_;
      uVar6 = uVar6 + 1;
    } while ((uVar7 >> 2 & 0xffffffff) != uVar6);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&this->context_symbols_,(long)((this->max_valence_ - this->min_valence_) + 1));
  return true;
}

Assistant:

bool Init(MeshEdgebreakerEncoderImplInterface *encoder) {
    if (!MeshEdgebreakerTraversalEncoder::Init(encoder)) {
      return false;
    }
    min_valence_ = 2;
    max_valence_ = 7;
    corner_table_ = encoder->GetCornerTable();

    // Initialize valences of all vertices.
    vertex_valences_.resize(corner_table_->num_vertices());
    for (VertexIndex i(0); i < static_cast<uint32_t>(vertex_valences_.size());
         ++i) {
      vertex_valences_[i] = corner_table_->Valence(VertexIndex(i));
    }

    // Replicate the corner to vertex map from the corner table. We need to do
    // this because the map may get updated during encoding because we add new
    // vertices when we encounter split symbols.
    corner_to_vertex_map_.resize(corner_table_->num_corners());
    for (CornerIndex i(0); i < corner_table_->num_corners(); ++i) {
      corner_to_vertex_map_[i] = corner_table_->Vertex(i);
    }
    const int32_t num_unique_valences = max_valence_ - min_valence_ + 1;

    context_symbols_.resize(num_unique_valences);
    return true;
  }